

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_proj.c
# Opt level: O0

int cvProjInit(CVodeProjMem proj_mem)

{
  CVodeProjMem proj_mem_local;
  int local_4;
  
  if (proj_mem == (CVodeProjMem)0x0) {
    local_4 = -0x1d;
  }
  else {
    proj_mem->first_proj = 1;
    proj_mem->nstlprj = 0;
    proj_mem->nproj = 0;
    proj_mem->npfails = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int cvProjInit(CVodeProjMem proj_mem)
{
  /* check if projection memory exists */
  if (proj_mem == NULL) { return (CV_PROJ_MEM_NULL); }

  /* reset flags and counters */
  proj_mem->first_proj = SUNTRUE;
  proj_mem->nstlprj    = 0;
  proj_mem->nproj      = 0;
  proj_mem->npfails    = 0;

  return (CV_SUCCESS);
}